

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O2

optional_idx __thiscall
duckdb::FunctionBinder::BindFunctionCost
          (FunctionBinder *this,SimpleFunction *func,vector<duckdb::LogicalType,_true> *arguments)

{
  bool bVar1;
  optional_idx oVar2;
  pointer pLVar3;
  const_reference pvVar4;
  CastFunctionSet *this_00;
  const_reference target;
  int64_t iVar5;
  pointer pLVar6;
  idx_t i;
  ulong __n;
  idx_t index;
  optional_idx local_38;
  
  if ((func->varargs).id_ != INVALID) {
    oVar2 = BindVarArgsFunctionCost(this,func,arguments);
    return (optional_idx)oVar2.index;
  }
  pLVar6 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  oVar2.index = 0xffffffffffffffff;
  if ((long)(func->arguments).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(func->arguments).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start == (long)pLVar3 - (long)pLVar6) {
    bVar1 = false;
    index = 0;
    for (__n = 0; __n < (ulong)(((long)pLVar3 - (long)pLVar6) / 0x18); __n = __n + 1) {
      pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(arguments,__n);
      if (pvVar4->id_ == UNKNOWN) {
        bVar1 = true;
      }
      else {
        this_00 = CastFunctionSet::Get(this->context);
        pvVar4 = vector<duckdb::LogicalType,_true>::get<true>(arguments,__n);
        target = vector<duckdb::LogicalType,_true>::get<true>(&func->arguments,__n);
        iVar5 = CastFunctionSet::ImplicitCastCost(this_00,pvVar4,target);
        if (iVar5 < 0) {
          return (optional_idx)0xffffffffffffffff;
        }
        index = index + iVar5;
      }
      pLVar6 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      pLVar3 = (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
    }
    if (bVar1) {
      oVar2.index = 0;
    }
    else {
      optional_idx::optional_idx(&local_38,index);
      oVar2.index = local_38.index;
    }
  }
  return (optional_idx)oVar2.index;
}

Assistant:

optional_idx FunctionBinder::BindFunctionCost(const SimpleFunction &func, const vector<LogicalType> &arguments) {
	if (func.HasVarArgs()) {
		// special case varargs function
		return BindVarArgsFunctionCost(func, arguments);
	}
	if (func.arguments.size() != arguments.size()) {
		// invalid argument count: check the next function
		return optional_idx();
	}
	idx_t cost = 0;
	bool has_parameter = false;
	for (idx_t i = 0; i < arguments.size(); i++) {
		if (arguments[i].id() == LogicalTypeId::UNKNOWN) {
			has_parameter = true;
			continue;
		}
		int64_t cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(arguments[i], func.arguments[i]);
		if (cast_cost >= 0) {
			// we can implicitly cast, add the cost to the total cost
			cost += idx_t(cast_cost);
		} else {
			// we can't implicitly cast: throw an error
			return optional_idx();
		}
	}
	if (has_parameter) {
		// all arguments are implicitly castable and there is a parameter - return 0 as cost
		return 0;
	}
	return cost;
}